

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void __thiscall json::Json::Json(Json *this,istream *istream)

{
  istreambuf_iterator<char,_std::char_traits<char>_> __beg;
  istreambuf_iterator<char,_std::char_traits<char>_> __end;
  allocator<char> local_69;
  undefined1 local_68 [12];
  undefined1 local_58 [12];
  string local_48 [48];
  istream *local_18;
  istream *istream_local;
  Json *this_local;
  
  this->type = IsInvalid;
  local_18 = istream;
  istream_local = (istream *)this;
  Object::Object(&this->object);
  Array::Array(&this->array);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_58,local_18);
  std::istreambuf_iterator<char,_std::char_traits<char>_>::istreambuf_iterator
            ((istreambuf_iterator<char,_std::char_traits<char>_> *)local_68);
  std::allocator<char>::allocator();
  __beg._12_4_ = 0;
  __beg._M_sbuf = (streambuf_type *)local_58._0_8_;
  __beg._M_c = local_58._8_4_;
  __end._12_4_ = 0;
  __end._M_sbuf = (streambuf_type *)local_68._0_8_;
  __end._M_c = local_68._8_4_;
  std::__cxx11::string::string<std::istreambuf_iterator<char,std::char_traits<char>>,void>
            (local_48,__beg,__end,&local_69);
  init(this,(EVP_PKEY_CTX *)local_48);
  std::__cxx11::string::~string(local_48);
  std::allocator<char>::~allocator(&local_69);
  return;
}

Assistant:

explicit Json(std::istream& istream) : type(IsInvalid) {
            init(std::string(std::istreambuf_iterator<char>(istream), std::istreambuf_iterator<char>()));
        }